

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O3

XrResult xrPathToString(XrInstance instance,XrPath path,uint32_t bufferCapacityInput,
                       uint32_t *bufferCountOutput,char *buffer)

{
  XrResult XVar1;
  LoaderInstance *loader_instance;
  LoaderInstance *local_a8 [16];
  
  XVar1 = ActiveLoaderInstance::Get(local_a8,"xrPathToString");
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    XVar1 = (*((local_a8[0]->_dispatch_table)._M_t.
               super___uniq_ptr_impl<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
               ._M_t.
               super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
               .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl)->
              PathToString)(instance,path,bufferCapacityInput,bufferCountOutput,buffer);
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrPathToString(
    XrInstance                                  instance,
    XrPath                                      path,
    uint32_t                                    bufferCapacityInput,
    uint32_t*                                   bufferCountOutput,
    char*                                       buffer) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrPathToString");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->PathToString(instance, path, bufferCapacityInput, bufferCountOutput, buffer);
    }
    return result;
}